

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

String * __thiscall
Jinx::Impl::Parser::ParseVariable_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  pointer pSVar1;
  Symbol *pSVar2;
  pointer pcVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  char *format;
  long lVar7;
  Symbol *pSVar8;
  
  if ((this->m_error == false) &&
     (pSVar1 = (this->m_currentSymbol)._M_current,
     pSVar1 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    if (pSVar1->type == NameValue) {
      sVar5 = VariableStackFrame::GetMaxVariableParts(&this->m_variableStackFrame);
      if (sVar5 != 0) {
        do {
          pSVar2 = (this->m_currentSymbol)._M_current;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = (pSVar2->text)._M_dataplus._M_p;
          std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                              __return_storage_ptr__,pcVar3,pcVar3 + (pSVar2->text)._M_string_length
                             );
          lVar7 = 1;
          if (1 < sVar5) {
            uVar6 = 1;
            do {
              pSVar8 = pSVar2 + 1;
              if ((((this->m_error == false) &&
                   (pSVar8 != (this->m_symbolList->
                              super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                              )._M_impl.super__Vector_impl_data._M_finish)) &&
                  (pSVar8->type != NewLine)) && (pSVar2[1].text._M_string_length != 0)) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                append(__return_storage_ptr__," ");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                _M_append(__return_storage_ptr__,pSVar2[1].text._M_dataplus._M_p,
                          pSVar2[1].text._M_string_length);
                lVar7 = lVar7 + 1;
              }
              uVar6 = uVar6 + 1;
              pSVar2 = pSVar8;
            } while (uVar6 < sVar5);
          }
          bVar4 = VariableStackFrame::VariableExists
                            (&this->m_variableStackFrame,__return_storage_ptr__);
          if (bVar4) {
            if (lVar7 == 0) {
              return __return_storage_ptr__;
            }
            pSVar2 = (this->m_currentSymbol)._M_current;
            this->m_lastLine = pSVar2[lVar7 + -1].lineNumber;
            (this->m_currentSymbol)._M_current = pSVar2 + lVar7;
            return __return_storage_ptr__;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)(__return_storage_ptr__->_M_dataplus)._M_p != &__return_storage_ptr__->field_2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_destroy(__return_storage_ptr__,
                       (__return_storage_ptr__->field_2)._M_allocated_capacity);
          }
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      format = "Could not parse variable name";
    }
    else {
      format = "Unexpected symbol type when parsing variable";
    }
    Error<>(this,format);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseVariable()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing variable");
			return String();
		}

		// Check up to the max number of parts until we find a variable match
		auto maxParts = m_variableStackFrame.GetMaxVariableParts();
		for (size_t s = maxParts; s > 0; --s)
		{
			auto curr = m_currentSymbol;
			auto name = String(curr->text);
			size_t symbolCount = 1;
			for (size_t i = 1; i < s; ++i)
			{
				++curr;
				if (!IsSymbolValid(curr) || curr->text.empty())
					continue;
				name += " ";
				name += curr->text;
				++symbolCount;
			}
			bool exists = VariableExists(name);
			if (exists)
			{
				// Now that we know the longest variable count that matches, advance this number of symbols
				for (size_t i = 0; i < symbolCount; ++i)
					NextSymbol();

				// Return the variable name
				return name;
			}
		}
		Error("Could not parse variable name");
		return String();
	}